

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

Opnd * __thiscall IR::Instr::SetDst(Instr *this,Opnd *newDst)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegOpnd *pRVar4;
  Opnd *this_00;
  SymOpnd *pSVar5;
  StackSym *this_01;
  
  if (newDst == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x895,"(newDst != nullptr)","Calling SetDst with a NULL dst");
    if (!bVar2) goto LAB_004800c8;
    *puVar3 = 0;
  }
  if (this->m_dst != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x896,"(this->m_dst == nullptr)",
                       "Calling SetDst without unlinking/freeing the current dst");
    if (!bVar2) goto LAB_004800c8;
    *puVar3 = 0;
  }
  bVar2 = Opnd::IsRegOpnd(newDst);
  if ((bVar2) && (pRVar4 = Opnd::AsRegOpnd(newDst), (pRVar4->field_0x18 & 0x40) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x897,"(!(newDst->IsRegOpnd() && newDst->AsRegOpnd()->IsSymValueFrozen()))",
                       "!(newDst->IsRegOpnd() && newDst->AsRegOpnd()->IsSymValueFrozen())");
    if (!bVar2) goto LAB_004800c8;
    *puVar3 = 0;
  }
  this_00 = Opnd::Use(newDst,this->m_func);
  this->m_dst = this_00;
  bVar2 = Opnd::IsRegOpnd(this_00);
  if ((bVar2) && (pRVar4 = Opnd::AsRegOpnd(this_00), pRVar4->m_sym != (StackSym *)0x0)) {
    pSVar5 = (SymOpnd *)Opnd::AsRegOpnd(this_00);
  }
  else {
    bVar2 = Opnd::IsSymOpnd(this_00);
    if (!bVar2) {
      return this_00;
    }
    pSVar5 = Opnd::AsSymOpnd(this_00);
    if (pSVar5->m_sym->m_kind != SymKindStack) {
      return this_00;
    }
    pSVar5 = Opnd::AsSymOpnd(this_00);
  }
  this_01 = Sym::AsStackSym((Sym *)pSVar5->m_sym);
  if ((this_01 != (StackSym *)0x0) && ((this_01->field_0x18 & 1) != 0)) {
    if ((this_01->field_5).m_instrDef == (Instr *)0x0) {
      (this_01->field_5).m_instrDef = this;
    }
    else {
      bVar2 = StackSym::IsArgSlotSym(this_01);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                           ,0x8b1,"(!stackSym->IsArgSlotSym())",
                           "Arg Slot sym needs to be single def to maintain the StartCall arg links"
                          );
        if (!bVar2) {
LAB_004800c8:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      (this_01->field_5).m_instrDef = (Instr *)0x0;
      *(uint *)&this_01->field_0x18 = *(uint *)&this_01->field_0x18 & 0xfffff244;
    }
  }
  return this_00;
}

Assistant:

Opnd *
Instr::SetDst(Opnd * newDst)
{
    AssertMsg(newDst != nullptr, "Calling SetDst with a NULL dst");
    AssertMsg(this->m_dst == nullptr, "Calling SetDst without unlinking/freeing the current dst");
    Assert(!(newDst->IsRegOpnd() && newDst->AsRegOpnd()->IsSymValueFrozen()));

    newDst = newDst->Use(m_func);
    this->m_dst = newDst;

    // If newDst isSingleDef, set instrDef

    StackSym *stackSym;

    if (newDst->IsRegOpnd() && newDst->AsRegOpnd()->m_sym)
    {
        stackSym = newDst->AsRegOpnd()->m_sym->AsStackSym();
    }
    else if (newDst->IsSymOpnd() && newDst->AsSymOpnd()->m_sym->IsStackSym())
    {
        stackSym = newDst->AsSymOpnd()->m_sym->AsStackSym();
    }
    else
    {
        stackSym = nullptr;
    }

    if (stackSym && stackSym->m_isSingleDef)
    {
        if (stackSym->m_instrDef)
        {
            AssertMsg(!stackSym->IsArgSlotSym(), "Arg Slot sym needs to be single def to maintain the StartCall arg links");

            // Multiple defs, clear isSingleDef flag
            stackSym->m_isSingleDef = false;
            stackSym->m_instrDef    = nullptr;
            stackSym->m_isConst     = false;
            stackSym->m_isIntConst  = false;
            stackSym->m_isInt64Const= false;
            stackSym->m_isTaggableIntConst  = false;
            stackSym->m_isNotNumber    = false;
            stackSym->m_isStrConst  = false;
            stackSym->m_isStrEmpty  = false;
            stackSym->m_isFltConst  = false;
        }
        else
        {
            stackSym->m_instrDef = this;
        }
    }

    return newDst;
}